

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

string * __thiscall
cs_impl::any::holder<cs::type_id>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,holder<cs::type_id> *this)

{
  char *pcVar1;
  char *in_RDX;
  unsigned_long *val;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if ((this->mDat).type_hash == 0) {
    pcVar1 = *(char **)((this->mDat).type_idx._M_target + 8);
    cxx_demangle_abi_cxx11_(__return_storage_ptr__,(cs_impl *)(pcVar1 + (*pcVar1 == '*')),in_RDX);
  }
  else {
    pcVar1 = *(char **)((this->mDat).type_idx._M_target + 8);
    cxx_demangle_abi_cxx11_(&local_38,(cs_impl *)(pcVar1 + (*pcVar1 == '*')),in_RDX);
    std::operator+(&local_58,&local_38,"_");
    to_string_if<unsigned_long,true>::to_string_abi_cxx11_
              (&sStack_78,(to_string_if<unsigned_long,true> *)&(this->mDat).type_hash,val);
    std::operator+(__return_storage_ptr__,&local_58,&sStack_78);
    std::__cxx11::string::~string((string *)&sStack_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}